

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobatto_polynomial.cpp
# Opt level: O3

double * lobatto_polynomial_derivative(int m,int n,double *x)

{
  void *pvVar1;
  double dVar2;
  ulong uVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  void *pvVar7;
  double *pdVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  double *pdVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  double *local_60;
  double *local_58;
  long local_50;
  
  uVar19 = (ulong)(uint)n;
  uVar3 = (ulong)(uint)m;
  uVar11 = (ulong)(uint)(n * m) * 8;
  if (n * m < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar11);
  uVar4 = (n + 1) * m;
  uVar11 = (ulong)uVar4 * 8;
  if ((int)uVar4 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar11);
  pvVar7 = operator_new__(uVar11);
  if (0 < m) {
    pvVar1 = (void *)((long)pvVar7 + uVar3 * 8);
    pvVar14 = (void *)((long)pvVar7 + uVar3 * 0x10);
    pdVar16 = pdVar5 + uVar3;
    local_60 = pdVar6 + uVar3 * 2;
    local_50 = 0;
    uVar11 = 0;
    pvVar13 = pvVar1;
    pvVar15 = pvVar14;
    local_58 = pdVar6;
    do {
      if (0 < n) {
        dVar2 = x[uVar11];
        pdVar5[uVar11] = dVar2 * -2.0;
        if (n != 1) {
          pdVar6[uVar11] = 1.0;
          pdVar6[uVar11 + uVar3] = dVar2;
          uVar12 = 1;
          iVar18 = 3;
          iVar17 = 2;
          pdVar8 = local_58;
          do {
            pdVar8[uVar3 * 2] =
                 ((double)iVar18 * dVar2 * pdVar8[uVar3] - (double)(int)uVar12 * *pdVar8) /
                 (double)iVar17;
            pdVar8 = pdVar8 + uVar3;
            uVar12 = uVar12 + 1;
            iVar18 = iVar18 + 2;
            iVar17 = iVar17 + 1;
          } while (uVar19 != uVar12);
          *(undefined8 *)((long)pvVar7 + uVar11 * 8) = 0;
          *(undefined8 *)((long)pvVar7 + (uVar11 + uVar3) * 8) = 0x3ff0000000000000;
          if (1 < n) {
            uVar12 = 1;
            iVar17 = 3;
            iVar18 = 2;
            lVar9 = local_50;
            do {
              iVar10 = (int)uVar12;
              uVar12 = uVar12 + 1;
              *(double *)((long)pvVar14 + lVar9) =
                   ((*(double *)((long)pvVar1 + lVar9) * dVar2 +
                    *(double *)((long)pdVar6 + lVar9 + uVar3 * 8)) * (double)iVar17 -
                   (double)iVar10 * *(double *)((long)pvVar7 + lVar9)) / (double)iVar18;
              iVar17 = iVar17 + 2;
              lVar9 = lVar9 + uVar3 * 8;
              iVar18 = iVar18 + 1;
            } while (uVar19 != uVar12);
            if (1 < n) {
              uVar12 = 1;
              lVar9 = 0;
              do {
                uVar12 = uVar12 + 1;
                *(double *)((long)pdVar16 + lVar9) =
                     (*(double *)((long)pvVar15 + lVar9) * -dVar2 +
                     (*(double *)((long)pvVar13 + lVar9) - *(double *)((long)local_60 + lVar9))) *
                     (double)(int)uVar12;
                lVar9 = lVar9 + uVar3 * 8;
              } while (uVar19 != uVar12);
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
      local_58 = local_58 + 1;
      local_50 = local_50 + 8;
      pvVar13 = (void *)((long)pvVar13 + 8);
      pdVar16 = pdVar16 + 1;
      local_60 = local_60 + 1;
      pvVar15 = (void *)((long)pvVar15 + 8);
    } while (uVar11 != uVar3);
  }
  operator_delete__(pdVar6);
  operator_delete__(pvVar7);
  return pdVar5;
}

Assistant:

double *lobatto_polynomial_derivative ( int m, int n, double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    LOBATTO_POLYNOMIAL_DERIVATIVE: derivative of completed Lobatto polynomial.
//
//  Discussion:
//
//    L(N,X)  =  N * ( P(N-1,X) - X * P(N,X) )
//    L'(N,X) =  N * ( P'(N-1,X) - P(N,X) - X * P'(N,X) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 November 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Larry Andrews,
//    Special Functions of Mathematics for Engineers,
//    Second Edition,
//    Oxford University Press, 1998,
//    ISBN: 0819426164,
//    LC: QA351.A75.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input, int M, the number of evaluation points.
//
//    Input, int N, the highest order polynomial to evaluate.
//    Note that polynomials 0 through N will be evaluated.
//
//    Input, double X[M], the evaluation points.
//
//    Output, double LOBATTO_POLYNOMIAL_DERIVATIVE[M*N], the derivative of
//    the completed Lobatto polynomials of order 1 through N at the point X.
//
{
  int i;
  int j;
  double *lp;
  double *p;
  double *pp;

  lp = new double[m*n];
  p = new double[m*(n+1)];
  pp = new double[m*(n+1)];

  for ( i = 0; i < m; i++ )
  {
    if ( 1 <= n )
    {
      lp[i+0*m] = - 2.0 * x[i];

      if ( 2 <= n )
      {
        p[i+0*m] = 1.0;
        p[i+1*m] = x[i];
        for ( j = 1; j < n; j++ )
        {
          p[i+(j+1)*m] =
            ( double( 2 * j + 1 ) * x[i] * p[i+j*m]
            - double(     j     ) *        p[i+(j-1)*m] )
            / double(     j + 1 );
        }

        pp[i+0*m] = 0.0;
        pp[i+1*m] = 1.0;
        for ( j = 1; j < n; j++ )
        {
          pp[i+(j+1)*m] =
            ( double( 2 * j + 1 ) * ( p[i+j*m] + x[i] * pp[i+j*m] )
            - double(     j     ) *                     pp[i+(j-1)*m] )
            / double(     j + 1 );
        }

        for ( j = 1; j < n; j++ )
        {
          lp[i+j*m] =
            double( j + 1 )
            * ( pp[i+j*m] - p[i+(j+1)*m] - x[i] * pp[i+(j+1)*m] );
        }
      }
    }
  }

  delete [] p;
  delete [] pp;

  return lp;
}